

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  byte bVar1;
  byte bVar2;
  sqlite3_vtab *psVar3;
  u8 *puVar4;
  RtreeNode *pRVar5;
  long lVar6;
  MemValue val;
  Mem *pMem;
  sqlite3_vtab *psVar7;
  int rc;
  int local_2c;
  
  if (*(char *)((long)&cur[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&cur[4].pVtab + 4) == 0) {
      psVar7 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar7 = cur[6].pVtab;
    }
  }
  else {
    psVar7 = (sqlite3_vtab *)(cur + 7);
  }
  psVar3 = cur->pVtab;
  local_2c = 0;
  pRVar5 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)cur,&local_2c);
  if (local_2c != 0) {
    return local_2c;
  }
  if (psVar7 == (sqlite3_vtab *)0x0) {
    return 0;
  }
  bVar1 = *(byte *)((long)&psVar7->zErrMsg + 2);
  puVar4 = pRVar5->zData;
  bVar2 = psVar3[1].field_0xe;
  if (i == 0) {
    val.i = readInt64(puVar4 + (ulong)bVar2 * (ulong)bVar1 + 4);
    pMem = ctx->pOut;
    if ((pMem->flags & 0x2460) != 0) goto LAB_0018ba9a;
    (pMem->u).i = (i64)val;
  }
  else {
    lVar6 = (long)(int)((uint)bVar2 * (uint)bVar1 + i * 4 + 8);
    val.i = (ulong)puVar4[lVar6 + 3] |
            (ulong)puVar4[lVar6 + 2] << 8 |
            (long)(int)((uint)puVar4[lVar6] << 0x18) | (ulong)puVar4[lVar6 + 1] << 0x10;
    if (psVar3[1].field_0xd == '\0') {
      sqlite3VdbeMemSetDouble(ctx->pOut,(double)(float)val.nZero);
      return 0;
    }
    pMem = ctx->pOut;
    if ((pMem->flags & 0x2460) != 0) {
LAB_0018ba9a:
      vdbeReleaseAndSetInt64(pMem,val.i);
      return 0;
    }
    pMem->u = val;
  }
  pMem->flags = 4;
  return 0;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( p==0 ) return SQLITE_OK;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else{
    if( rc ) return rc;
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }
  return SQLITE_OK;
}